

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall spectest::JSONParser::ParseScript(JSONParser *this,Script *out_script)

{
  bool bVar1;
  Result RVar2;
  Command *in_RAX;
  pointer *__ptr;
  bool bVar3;
  _Head_base<0UL,_spectest::Command_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  RVar2 = Expect(this,"{");
  if ((((RVar2.enum_ != Error) &&
       (RVar2 = ParseKeyStringValue(this,"source_filename",&out_script->filename),
       RVar2.enum_ != Error)) && (RVar2 = Expect(this,","), RVar2.enum_ != Error)) &&
     ((RVar2 = ExpectKey(this,"commands"), RVar2.enum_ != Error &&
      (RVar2 = Expect(this,"["), RVar2.enum_ != Error)))) {
    bVar3 = true;
    do {
      bVar1 = Match(this,"]");
      if (bVar1) {
        RVar2 = Expect(this,"}");
        return (Result)(uint)(RVar2.enum_ == Error);
      }
      local_38._M_head_impl = (Command *)0x0;
      if ((bVar3) || (RVar2 = Expect(this,","), RVar2.enum_ != Error)) {
        RVar2 = ParseCommand(this,(CommandPtr *)&local_38);
        if (RVar2.enum_ != Error) {
          std::
          vector<std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>,std::allocator<std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>>>
          ::emplace_back<std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>>
                    ((vector<std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>,std::allocator<std::unique_ptr<spectest::Command,std::default_delete<spectest::Command>>>>
                      *)&out_script->commands,
                     (unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_> *)
                     &local_38);
          bVar1 = true;
          goto LAB_0016e2b5;
        }
        bVar1 = false;
      }
      else {
        bVar1 = false;
LAB_0016e2b5:
        bVar3 = false;
      }
      if (local_38._M_head_impl != (Command *)0x0) {
        (*(local_38._M_head_impl)->_vptr_Command[1])();
      }
    } while (bVar1);
  }
  return (Result)Error;
}

Assistant:

wabt::Result JSONParser::ParseScript(Script* out_script) {
  EXPECT("{");
  PARSE_KEY_STRING_VALUE("source_filename", &out_script->filename);
  EXPECT(",");
  EXPECT_KEY("commands");
  EXPECT("[");
  bool first = true;
  while (!Match("]")) {
    CommandPtr command;
    if (!first) {
      EXPECT(",");
    }
    CHECK_RESULT(ParseCommand(&command));
    out_script->commands.push_back(std::move(command));
    first = false;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}